

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe51At4(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)*buf >> 4) | ((ulong)*(uint6 *)(buf + 1) & 0x7fffffffffff) << 4;
}

Assistant:

std::uint64_t readFlUIntLe51At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 4;
    res |= (buf[0] >> 4);
    res &= UINT64_C(0x7ffffffffffff);
    return res;
}